

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

void __thiscall wabt::interp::Thread::Mark(Thread *this)

{
  pointer pFVar1;
  uint *puVar2;
  pointer pRVar3;
  Store *this_00;
  vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *__range2;
  Frame *frame;
  pointer pFVar4;
  uint *puVar5;
  pointer pRVar6;
  
  pFVar1 = (this->frames_).
           super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pFVar4 = (this->frames_).
                super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
                _M_impl.super__Vector_impl_data._M_start; pFVar4 != pFVar1; pFVar4 = pFVar4 + 1) {
    Store::Mark(this->store_,(Ref)(pFVar4->func).index);
  }
  puVar2 = (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar5 = (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    Store::Mark(this->store_,
                (Ref)(this->values_).
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_start[*puVar5].field_0.ref_.index);
  }
  pRVar6 = (this->exceptions_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar3 = (this->exceptions_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar6 != pRVar3) {
    this_00 = this->store_;
    do {
      Store::Mark(this_00,(Ref)pRVar6->index);
      pRVar6 = pRVar6 + 1;
    } while (pRVar6 != pRVar3);
  }
  return;
}

Assistant:

void Thread::Mark() {
  for (auto&& frame : frames_) {
    frame.Mark(store_);
  }
  for (auto index : refs_) {
    store_.Mark(values_[index].Get<Ref>());
  }
  store_.Mark(exceptions_);
}